

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O3

int __thiscall QTreeViewPrivate::firstVisibleItem(QTreeViewPrivate *this,int *offset)

{
  uint uVar1;
  int iVar2;
  int item;
  ulong uVar3;
  int iVar4;
  
  uVar1 = QAbstractSlider::value
                    (&((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.vbar)
                      ->super_QAbstractSlider);
  if ((this->super_QAbstractItemViewPrivate).verticalScrollMode == ScrollPerItem) {
    if (offset != (int *)0x0) {
      *offset = 0;
    }
    if (-1 < (int)uVar1) {
      if ((ulong)(this->viewItems).d.size <= (ulong)uVar1) {
        return -1;
      }
      return uVar1;
    }
  }
  else {
    if (this->uniformRowHeights == false) {
      if ((this->viewItems).d.size == 0) {
        return -1;
      }
      uVar3 = 0;
      iVar4 = 0;
      do {
        item = (int)uVar3;
        iVar2 = itemHeight(this,item);
        iVar4 = iVar2 + iVar4;
        if ((int)uVar1 < iVar4) {
          if (offset == (int *)0x0) {
            return item;
          }
          iVar2 = itemHeight(this,item);
          *offset = iVar4 - (uVar1 + iVar2);
          return item;
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 < (ulong)(this->viewItems).d.size);
      return -1;
    }
    iVar4 = this->defaultItemHeight;
    if (iVar4 != 0) {
      if (offset != (int *)0x0) {
        *offset = -((int)uVar1 % iVar4);
        iVar4 = this->defaultItemHeight;
      }
      return (int)uVar1 / iVar4;
    }
  }
  return -1;
}

Assistant:

int QTreeViewPrivate::firstVisibleItem(int *offset) const
{
    const int value = vbar->value();
    if (verticalScrollMode == QAbstractItemView::ScrollPerItem) {
        if (offset)
            *offset = 0;
        return (value < 0 || value >= viewItems.size()) ? -1 : value;
    }
    // ScrollMode == ScrollPerPixel
    if (uniformRowHeights) {
        if (!defaultItemHeight)
            return -1;

        if (offset)
            *offset = -(value % defaultItemHeight);
        return value / defaultItemHeight;
    }
    int y = 0; // ### (maybe do like QHeaderView by letting items have startposition)
    for (int i = 0; i < viewItems.size(); ++i) {
        y += itemHeight(i); // the height value is cached
        if (y > value) {
            if (offset)
                *offset = y - value - itemHeight(i);
            return i;
        }
    }
    return -1;
}